

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

String<char> * __thiscall Qentem::String<char>::operator=(String<char> *this,String<char> *src)

{
  SizeT len;
  char *str;
  String<char> *src_local;
  String<char> *this_local;
  
  if (this != src) {
    deallocate(this);
    str = First(src);
    len = Length(src);
    copyString(this,str,len);
  }
  return this;
}

Assistant:

String &operator=(const String &src) {
        if (this != &src) {
            deallocate();
            copyString(src.First(), src.Length());
        }

        return *this;
    }